

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqvm.cpp
# Opt level: O0

bool __thiscall
SQVM::InvokeDefaultDelegate(SQVM *this,SQObjectPtr *self,SQObjectPtr *key,SQObjectPtr *dest)

{
  SQObjectType SVar1;
  bool bVar2;
  SQTable *local_38;
  SQTable *ddel;
  SQObjectPtr *dest_local;
  SQObjectPtr *key_local;
  SQObjectPtr *self_local;
  SQVM *this_local;
  
  SVar1 = (self->super_SQObject)._type;
  if (((SVar1 == OT_BOOL) || (SVar1 == OT_INTEGER)) || (SVar1 == OT_FLOAT)) {
    local_38 = (this->_sharedstate->_number_default_delegate).super_SQObject._unVal.pTable;
  }
  else if (SVar1 == OT_STRING) {
    local_38 = (this->_sharedstate->_string_default_delegate).super_SQObject._unVal.pTable;
  }
  else if (SVar1 == OT_ARRAY) {
    local_38 = (this->_sharedstate->_array_default_delegate).super_SQObject._unVal.pTable;
  }
  else if ((SVar1 == OT_CLOSURE) || (SVar1 == OT_NATIVECLOSURE)) {
    local_38 = (this->_sharedstate->_closure_default_delegate).super_SQObject._unVal.pTable;
  }
  else if (SVar1 == OT_GENERATOR) {
    local_38 = (this->_sharedstate->_generator_default_delegate).super_SQObject._unVal.pTable;
  }
  else if (SVar1 == OT_THREAD) {
    local_38 = (this->_sharedstate->_thread_default_delegate).super_SQObject._unVal.pTable;
  }
  else if (SVar1 == OT_CLASS) {
    local_38 = (this->_sharedstate->_class_default_delegate).super_SQObject._unVal.pTable;
  }
  else if (SVar1 == OT_WEAKREF) {
    local_38 = (this->_sharedstate->_weakref_default_delegate).super_SQObject._unVal.pTable;
  }
  else if (SVar1 == OT_TABLE) {
    local_38 = (this->_sharedstate->_table_default_delegate).super_SQObject._unVal.pTable;
  }
  else {
    if (SVar1 != OT_INSTANCE) {
      return false;
    }
    local_38 = (this->_sharedstate->_instance_default_delegate).super_SQObject._unVal.pTable;
  }
  bVar2 = SQTable::Get(local_38,key,dest);
  return bVar2;
}

Assistant:

bool SQVM::InvokeDefaultDelegate(const SQObjectPtr &self,const SQObjectPtr &key,SQObjectPtr &dest)
{
    SQTable *ddel = NULL;
    switch(sq_type(self)) {
        case OT_CLASS: ddel = _class_ddel; break;
        case OT_TABLE: ddel = _table_ddel; break;
        case OT_ARRAY: ddel = _array_ddel; break;
        case OT_STRING: ddel = _string_ddel; break;
        case OT_INSTANCE: ddel = _instance_ddel; break;
        case OT_INTEGER:case OT_FLOAT:case OT_BOOL: ddel = _number_ddel; break;
        case OT_GENERATOR: ddel = _generator_ddel; break;
        case OT_CLOSURE: case OT_NATIVECLOSURE: ddel = _closure_ddel; break;
        case OT_THREAD: ddel = _thread_ddel; break;
        case OT_WEAKREF: ddel = _weakref_ddel; break;
        default: return false;
    }
    return  ddel->Get(key,dest);
}